

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE
IoTHubClient_LL_UploadToBlob_Create
          (IOTHUB_CLIENT_CONFIG *config,IOTHUB_AUTHORIZATION_HANDLE auth_handle)

{
  IOTHUB_CREDENTIAL_TYPE IVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE __s;
  size_t __n;
  size_t __n_00;
  char *pcVar4;
  size_t local_a8;
  long local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  ulong local_78;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  char *insert_pos;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  size_t malloc_size;
  size_t iotHubSuffixLength;
  size_t iotHubNameLength;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA_conflict *upload_data;
  IOTHUB_AUTHORIZATION_HANDLE auth_handle_local;
  IOTHUB_CLIENT_CONFIG *config_local;
  
  if ((auth_handle == (IOTHUB_AUTHORIZATION_HANDLE)0x0) || (config == (IOTHUB_CLIENT_CONFIG *)0x0))
  {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"IoTHubClient_LL_UploadToBlob_Create",0x32c,1,
                "Invalid arguments auth_handle: %p, config: %p",auth_handle,config);
    }
  }
  else {
    __s = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)malloc(0x88);
    if (__s == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_Create",0x334,1,"Failed malloc allocation");
      }
    }
    else {
      memset(__s,0,0x88);
      __s->authorization_module = auth_handle;
      __n = strlen(config->iotHubName);
      __n_00 = strlen(config->iotHubSuffix);
      if (__n < 0xfffffffffffffffe) {
        local_78 = __n + 1;
      }
      else {
        local_78 = 0xffffffffffffffff;
      }
      if (local_78 < -__n_00 - 1) {
        if (__n < 0xfffffffffffffffe) {
          local_80 = __n + 1;
        }
        else {
          local_80 = -1;
        }
        local_88 = local_80 + __n_00;
      }
      else {
        local_88 = 0xffffffffffffffff;
      }
      if (local_88 < 0xfffffffffffffffe) {
        if (__n < 0xfffffffffffffffe) {
          local_90 = __n + 1;
        }
        else {
          local_90 = 0xffffffffffffffff;
        }
        if (local_90 < -__n_00 - 1) {
          if (__n < 0xfffffffffffffffe) {
            local_98 = __n + 1;
          }
          else {
            local_98 = -1;
          }
          local_a0 = local_98 + __n_00;
        }
        else {
          local_a0 = -1;
        }
        local_a8 = local_a0 + 1;
      }
      else {
        local_a8 = 0xffffffffffffffff;
      }
      if (local_a8 != 0xffffffffffffffff) {
        pcVar4 = (char *)malloc(local_a8);
        __s->hostname = pcVar4;
        if (pcVar4 != (char *)0x0) {
          pcVar4 = IoTHubClient_Auth_Get_DeviceId(__s->authorization_module);
          __s->deviceId = pcVar4;
          if (pcVar4 == (char *)0x0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"IoTHubClient_LL_UploadToBlob_Create",0x34b,1,"Failed retrieving device ID"
                       );
            }
            free(__s->hostname);
            free(__s);
            return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0;
          }
          pcVar4 = __s->hostname;
          memcpy(pcVar4,config->iotHubName,__n);
          pcVar4 = pcVar4 + __n;
          *pcVar4 = '.';
          memcpy(pcVar4 + 1,config->iotHubSuffix,__n_00);
          (pcVar4 + 1)[__n_00] = '\0';
          IVar1 = IoTHubClient_Auth_Get_Credential_Type(__s->authorization_module);
          __s->cred_type = IVar1;
          if ((__s->cred_type == IOTHUB_CREDENTIAL_TYPE_UNKNOWN) ||
             (__s->cred_type == IOTHUB_CREDENTIAL_TYPE_X509)) {
            __s->cred_type = IOTHUB_CREDENTIAL_TYPE_X509;
            (__s->credentials).x509_credentials.x509certificate = (char *)0x0;
            (__s->credentials).x509_credentials.x509privatekey = (char *)0x0;
            (__s->credentials).x509_credentials.x509privatekeyType = (int *)0x0;
            (__s->credentials).x509_credentials.engine = (char *)0x0;
            return __s;
          }
          if (__s->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC) {
            iVar2 = IoTHubClient_Auth_Get_x509_info
                              (__s->authorization_module,&(__s->credentials).supplied_sas_token,
                               &(__s->credentials).x509_credentials.x509privatekey);
            if (iVar2 != 0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_Create",0x36a,1,
                          "Failed getting x509 certificate information");
              }
              free(__s->hostname);
              free(__s);
              return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0;
            }
            return __s;
          }
          if (__s->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) {
            pcVar4 = IoTHubClient_Auth_Get_SasToken(__s->authorization_module,(char *)0x0,0,"");
            (__s->credentials).x509_credentials.x509certificate = pcVar4;
            if ((__s->credentials).x509_credentials.x509certificate == (char *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"IoTHubClient_LL_UploadToBlob_Create",0x375,1,
                          "Failed retrieving supplied sas token");
              }
              free(__s->hostname);
              free(__s);
              return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0;
            }
            return __s;
          }
          return __s;
        }
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"IoTHubClient_LL_UploadToBlob_Create",0x345,1,
                  "Failed malloc allocation, size:%zu",local_a8);
      }
      free(__s);
    }
  }
  return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE IoTHubClient_LL_UploadToBlob_Create(const IOTHUB_CLIENT_CONFIG* config, IOTHUB_AUTHORIZATION_HANDLE auth_handle)
{
    IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data;
    if (auth_handle == NULL || config == NULL)
    {
        LogError("Invalid arguments auth_handle: %p, config: %p", auth_handle, config);
        upload_data = NULL;
    }
    else
    {
        upload_data = malloc(sizeof(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA));
        if (upload_data == NULL)
        {
            LogError("Failed malloc allocation");
            /*return as is*/
        }
        else
        {
            memset(upload_data, 0, sizeof(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA));

            upload_data->authorization_module = auth_handle;

            size_t iotHubNameLength = strlen(config->iotHubName);
            size_t iotHubSuffixLength = strlen(config->iotHubSuffix);

            /*first +1 is because "." the second +1 is because \0*/
            size_t malloc_size = safe_add_size_t(safe_add_size_t(safe_add_size_t(iotHubNameLength, 1), iotHubSuffixLength), 1);
            if (malloc_size == SIZE_MAX ||
                (upload_data->hostname = malloc(malloc_size)) == NULL)
            {
                LogError("Failed malloc allocation, size:%zu", malloc_size);
                free(upload_data);
                upload_data = NULL;
            }
            else if ((upload_data->deviceId = IoTHubClient_Auth_Get_DeviceId(upload_data->authorization_module)) == NULL)
            {
                LogError("Failed retrieving device ID");
                free(upload_data->hostname);
                free(upload_data);
                upload_data = NULL;
            }
            else
            {
                char* insert_pos = (char*)upload_data->hostname;
                (void)memcpy((char*)insert_pos, config->iotHubName, iotHubNameLength);
                insert_pos += iotHubNameLength;
                *insert_pos = '.';
                insert_pos += 1;
                (void)memcpy(insert_pos, config->iotHubSuffix, iotHubSuffixLength); /*+1 will copy the \0 too*/
                insert_pos += iotHubSuffixLength;
                *insert_pos = '\0';

                upload_data->cred_type = IoTHubClient_Auth_Get_Credential_Type(upload_data->authorization_module);
                // If the credential type is unknown then it means that we are using x509 because the certs need to get
                // passed down later in the process.
                if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_UNKNOWN || upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509)
                {
                    upload_data->cred_type = IOTHUB_CREDENTIAL_TYPE_X509;
                    upload_data->credentials.x509_credentials.x509certificate = NULL;
                    upload_data->credentials.x509_credentials.x509privatekey = NULL;
                    upload_data->credentials.x509_credentials.x509privatekeyType = NULL;
                    upload_data->credentials.x509_credentials.engine = NULL;
                }
                else if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC)
                {
                    if (IoTHubClient_Auth_Get_x509_info(upload_data->authorization_module, &upload_data->credentials.x509_credentials.x509certificate, &upload_data->credentials.x509_credentials.x509privatekey) != 0)
                    {
                        LogError("Failed getting x509 certificate information");
                        free(upload_data->hostname);
                        free(upload_data);
                        upload_data = NULL;
                    }
                }
                else if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
                {
                    upload_data->credentials.supplied_sas_token = IoTHubClient_Auth_Get_SasToken(upload_data->authorization_module, NULL, 0, EMPTY_STRING);
                    if (upload_data->credentials.supplied_sas_token == NULL)
                    {
                        LogError("Failed retrieving supplied sas token");
                        free(upload_data->hostname);
                        free(upload_data);
                        upload_data = NULL;
                    }
                }
            }
        }
    }

    return (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)upload_data;
}